

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_cached_string.c
# Opt level: O1

uintptr_t ht_feature_cached_string_add_mapping_
                    (HT_Timeline *timeline,HT_HashMap *map,uintptr_t hash,char *label)

{
  HT_Feature *pHVar1;
  char *pcVar2;
  HT_EventKlass *pHVar3;
  HT_TimestampNs HVar4;
  HT_EventIdProvider *provider;
  HT_ErrorCode error_code;
  HT_ErrorCode local_54;
  HT_Event local_50;
  uintptr_t local_38;
  char *local_30;
  
  pHVar1 = ht_timeline_get_feature
                     (timeline,(HT_FeatureKlass *)HT_FeatureCachedString_get_class_feature_klass);
  if (pHVar1 != (HT_Feature *)0x0) {
    if (pHVar1[1].klass != (HT_FeatureKlass *)0x0) {
      ht_mutex_lock((HT_Mutex *)pHVar1[1].klass);
    }
    pcVar2 = ht_hash_map_insert(map,hash,label,&local_54);
    if (pHVar1[1].klass != (HT_FeatureKlass *)0x0) {
      ht_mutex_unlock((HT_Mutex *)pHVar1[1].klass);
    }
    if (local_54 == HT_ERR_OK) {
      if (pcVar2 == (char *)0x0) {
        pHVar3 = ht_HT_StringMappingEvent_get_event_klass_instance();
        HVar4 = ht_monotonic_clock_get_timestamp();
        provider = ht_timeline_get_id_provider(timeline);
        local_50.id = ht_event_id_provider_next(provider);
        local_50.klass = pHVar3;
        local_50.timestamp = HVar4;
        local_38 = hash;
        local_30 = label;
        ht_timeline_push_event(timeline,&local_50);
      }
    }
    else {
      hash = 0;
    }
    return hash;
  }
  __assert_fail("f",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/feature_cached_string.c"
                ,0x76,
                "uintptr_t ht_feature_cached_string_add_mapping_(HT_Timeline *, HT_HashMap *, uintptr_t, const char *)"
               );
}

Assistant:

static uintptr_t
ht_feature_cached_string_add_mapping_(HT_Timeline* timeline, HT_HashMap* map, uintptr_t hash, const char* label)
{
    HT_FeatureCachedString* f = HT_FeatureCachedString_from_timeline(timeline);
    HT_ErrorCode error_code;

    assert(f);

    HT_FCS_LOCK_(f);

    const char* ret = ht_hash_map_insert(map, hash, label, &error_code);

    HT_FCS_UNLOCK_(f);
    if (error_code != HT_ERR_OK)
    {
        return 0;
    }

    if (ret == NULL)
    {
        HT_TIMELINE_PUSH_EVENT(timeline, HT_StringMappingEvent, hash, label);
    }
    return hash;
}